

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int walIndexReadHdr(Wal *pWal,int *pChanged)

{
  u8 uVar1;
  u32 uVar2;
  u32 *puVar3;
  bool bVar4;
  u8 *aFrame;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  sqlite3_int64 sVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  bool bVar17;
  u32 *page0;
  u32 pgno;
  u8 aBuf [32];
  u32 *aShare;
  i64 nSize;
  ulong local_f0;
  u32 *local_c8;
  ulong local_c0;
  ulong local_b8;
  u8 *local_b0;
  long local_a8;
  u32 local_a0;
  u32 local_9c;
  undefined4 local_98;
  uint local_94;
  undefined4 local_90;
  uint local_8c;
  undefined8 local_88;
  uint local_80;
  uint local_7c;
  u32 *local_78;
  ulong local_70;
  u32 *local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  u8 *local_40;
  ulong local_38;
  
  if (pWal->nWiData < 1) {
LAB_0014b27d:
    iVar5 = walIndexPageRealloc(pWal,0,&local_c8);
  }
  else {
    local_c8 = *pWal->apWiData;
    iVar5 = 0;
    if (local_c8 == (u32 *)0x0) goto LAB_0014b27d;
  }
  if (iVar5 != 0) {
    if (iVar5 != 0x508) {
      return iVar5;
    }
    pWal->bShmUnreliable = '\x01';
    pWal->exclusiveMode = '\x02';
    *pChanged = 1;
  }
  if ((local_c8 != (u32 *)0x0) && (iVar6 = walIndexTryHdr(pWal,pChanged), iVar6 == 0)) {
    bVar17 = true;
    goto LAB_0014b66f;
  }
  if ((pWal->bShmUnreliable == '\0') && ((pWal->readOnly & 2) != 0)) {
    iVar5 = 0;
    if (pWal->exclusiveMode == '\0') {
      iVar5 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,6);
    }
    if ((iVar5 == 0) && (iVar5 = 0x108, pWal->exclusiveMode == '\0')) {
      bVar17 = false;
      (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,5);
    }
    else {
      bVar17 = false;
    }
    goto LAB_0014b66f;
  }
  uVar1 = pWal->writeLock;
  if (uVar1 == '\0') {
    iVar5 = 0;
    if (pWal->exclusiveMode == '\0') {
      iVar5 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,10);
    }
    iVar6 = 1;
    if (iVar5 == 0) goto LAB_0014b2e8;
  }
  else {
LAB_0014b2e8:
    pWal->writeLock = '\x01';
    if (pWal->nWiData < 1) {
LAB_0014b306:
      iVar5 = walIndexPageRealloc(pWal,0,&local_c8);
    }
    else {
      local_c8 = *pWal->apWiData;
      iVar5 = 0;
      if (local_c8 == (u32 *)0x0) goto LAB_0014b306;
    }
    iVar6 = 1;
    if (iVar5 == 0) {
      iVar6 = walIndexTryHdr(pWal,pChanged);
      if (iVar6 == 0) {
        iVar5 = 0;
        iVar6 = 0;
      }
      else {
        iVar7 = 2 - (uint)pWal->ckptLock;
        iVar16 = pWal->ckptLock + 1;
        iVar5 = 0;
        if (pWal->exclusiveMode == '\0') {
          iVar5 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar16,iVar7,10);
        }
        if (iVar5 == 0) {
          (pWal->hdr).aSalt[0] = 0;
          (pWal->hdr).aSalt[1] = 0;
          (pWal->hdr).aCksum[0] = 0;
          (pWal->hdr).aCksum[1] = 0;
          (pWal->hdr).mxFrame = 0;
          (pWal->hdr).nPage = 0;
          (pWal->hdr).aFrameCksum[0] = 0;
          (pWal->hdr).aFrameCksum[1] = 0;
          (pWal->hdr).iVersion = 0;
          (pWal->hdr).unused = 0;
          (pWal->hdr).iChange = 0;
          (pWal->hdr).isInit = '\0';
          (pWal->hdr).bigEndCksum = '\0';
          (pWal->hdr).szPage = 0;
          iVar5 = (*pWal->pWalFd->pMethods->xFileSize)(pWal->pWalFd,&local_60);
          if (iVar5 == 0) {
            iVar5 = 0;
            if (0x20 < local_60) {
              iVar5 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,&local_98,0x20,0);
              lVar14 = 2;
              if (iVar5 != 0) {
LAB_0014b528:
                iVar5 = (*(code *)((long)&DAT_001df270 + (long)(int)(&DAT_001df270)[lVar14]))();
                return iVar5;
              }
              lVar14 = 3;
              if ((local_98._3_1_ & 0xfffffffe |
                  (local_98 >> 0x10 & 0xff) << 8 | (local_98 >> 8 & 0xff) << 0x10 | local_98 << 0x18
                  ) != 0x377f0682) goto LAB_0014b528;
              uVar12 = (int)((ulong)local_90._1_1_ << 0x10) + local_90 * 0x1000000;
              uVar13 = (local_90 >> 0x10 & 0xff) * 0x100;
              uVar15 = uVar12 + local_90._3_1_ | uVar13;
              if (uVar15 - 0x10001 < 0xffff01ff || (uVar15 & uVar15 - 1) != 0) goto LAB_0014b528;
              (pWal->hdr).bigEndCksum = (u8)(local_98._3_1_ & 1);
              pWal->szPage = uVar15;
              pWal->nCkpt = local_8c >> 0x18 | (local_8c & 0xff0000) >> 8 | (local_8c & 0xff00) << 8
                            | local_8c << 0x18;
              *(undefined8 *)(pWal->hdr).aSalt = local_88;
              local_c0 = (ulong)uVar12;
              local_a8 = (ulong)local_90._1_1_ << 0x10;
              walChecksumBytes(local_98._3_1_ & 1 ^ 1,(u8 *)&local_98,0x18,(u32 *)0x0,
                               (pWal->hdr).aFrameCksum);
              if ((pWal->hdr).aFrameCksum[0] !=
                  (local_80 >> 0x18 | (local_80 & 0xff0000) >> 8 | (local_80 & 0xff00) << 8 |
                  local_80 << 0x18)) {
                lVar14 = 3;
                goto LAB_0014b528;
              }
              lVar14 = 3;
              if ((pWal->hdr).aFrameCksum[1] !=
                  (local_7c >> 0x18 | (local_7c & 0xff0000) >> 8 | (local_7c & 0xff00) << 8 |
                  local_7c << 0x18)) goto LAB_0014b528;
              if ((local_94 >> 0x18 | (local_94 & 0xff0000) >> 8 | (local_94 & 0xff00) << 8 |
                  local_94 << 0x18) == 0x2de218) {
                local_b8 = (ulong)(uVar15 + 0x18);
                iVar5 = sqlite3_initialize();
                if (iVar5 == 0) {
                  local_b0 = (u8 *)sqlite3Malloc(local_b8 + 0x8000);
                }
                else {
                  local_b0 = (u8 *)0x0;
                }
                if (local_b0 == (u8 *)0x0) {
                  lVar14 = 2;
                }
                else {
                  local_40 = local_b0 + 0x18;
                  local_78 = (u32 *)(local_b0 + (ulong)uVar15 + 0x18);
                  local_50 = (local_60 + -0x20) / (long)local_b8;
                  local_58 = (ulong)((int)local_50 + 0x1000) + 0xffffffff021 >> 0xc;
                  local_50 = local_50 & 0xffffffff;
                  local_c0 = (ulong)((uint)(local_c0 >> 0x10) & 0xffff | uVar13);
                  local_70 = (ulong)(local_90 * 0x1000000 + (int)local_a8 + uVar13 +
                                     (uint)local_90._3_1_ + 0x18);
                  uVar8 = 0;
                  uVar12 = 0;
                  do {
                    uVar9 = uVar8 + 0xfde;
                    if (local_50 <= uVar8 + 0xfde) {
                      uVar9 = local_50;
                    }
                    uVar10 = (ulong)(uVar12 * 0x1000 + 0xfde);
                    if (local_50 < uVar10) {
                      uVar10 = local_50;
                    }
                    local_38 = uVar8;
                    walIndexPage(pWal,uVar12,&local_68);
                    if (local_68 == (u32 *)0x0) {
                      bVar17 = false;
                    }
                    else {
                      uVar13 = uVar12 * 0x1000 - 0x21;
                      if (uVar12 == 0) {
                        uVar13 = 1;
                      }
                      local_48 = (ulong)uVar12;
                      pWal->apWiData[local_48] = local_78;
                      bVar17 = (uint)uVar10 < uVar13;
                      if (uVar13 <= (uint)uVar10) {
                        local_f0 = (ulong)uVar13;
                        sVar11 = (local_f0 - 1) * local_70 + 0x20;
                        bVar17 = false;
                        do {
                          aFrame = local_b0;
                          local_a8 = sVar11;
                          iVar5 = (*pWal->pWalFd->pMethods->xRead)
                                            (pWal->pWalFd,local_b0,(int)local_b8,sVar11);
                          if ((iVar5 == 0) &&
                             (iVar5 = walDecodeFrame(pWal,&local_9c,&local_a0,local_40,aFrame),
                             iVar5 != 0)) {
                            iVar5 = walIndexAppend(pWal,(u32)local_f0,local_9c);
                            if (iVar5 == 0) {
                              bVar4 = true;
                              if (local_a0 != 0) {
                                (pWal->hdr).mxFrame = (u32)local_f0;
                                (pWal->hdr).nPage = local_a0;
                                (pWal->hdr).szPage = (u16)local_c0;
                              }
                            }
                            else {
                              bVar4 = false;
                            }
                          }
                          else {
                            bVar4 = false;
                          }
                          if (!bVar4) break;
                          bVar17 = uVar10 <= local_f0;
                          local_f0 = local_f0 + 1;
                          sVar11 = local_a8 + local_70;
                        } while (uVar9 + 1 != local_f0);
                      }
                      pWal->apWiData[local_48] = local_68;
                      lVar14 = 0;
                      if (uVar12 == 0) {
                        lVar14 = 0x88;
                      }
                      memcpy((void *)((long)local_68 + lVar14),(void *)((long)local_78 + lVar14),
                             0x8000 - lVar14);
                    }
                    if (!bVar17) break;
                    uVar12 = uVar12 + 1;
                    uVar8 = (ulong)((int)local_38 + 0x1000);
                  } while (uVar12 <= (uint)local_58);
                  sqlite3_free(local_b0);
                  lVar14 = 0;
                }
                goto LAB_0014b528;
              }
              iVar5 = 0xe;
              sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xfaaf,
                          "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
            }
            if (iVar5 == 0) {
              (pWal->hdr).aFrameCksum[0] = 0;
              (pWal->hdr).aFrameCksum[1] = 0;
              walIndexWriteHdr(pWal);
              puVar3 = *pWal->apWiData;
              lVar14 = 0;
              puVar3[0x18] = 0;
              puVar3[0x20] = (pWal->hdr).mxFrame;
              puVar3[0x19] = 0;
              do {
                iVar5 = 0;
                if (pWal->exclusiveMode == '\0') {
                  iVar5 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,(int)lVar14 + 4,1,10);
                }
                if (iVar5 != 5) {
                  if (iVar5 != 0) goto LAB_0014b621;
                  if ((lVar14 == 0) && (uVar2 = (pWal->hdr).mxFrame, uVar2 != 0)) {
                    puVar3[0x1a] = uVar2;
                  }
                  else {
                    puVar3[lVar14 + 0x1a] = 0xffffffff;
                  }
                  if (pWal->exclusiveMode == '\0') {
                    (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,(int)lVar14 + 4,1,9);
                  }
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != 4);
              if ((pWal->hdr).nPage != 0) {
                sqlite3_log(0x11b,"recovered %d frames from WAL file %s",(ulong)(pWal->hdr).mxFrame,
                            pWal->zWalName);
              }
            }
          }
LAB_0014b621:
          if (pWal->exclusiveMode == '\0') {
            (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar16,iVar7,9);
          }
        }
        *pChanged = 1;
      }
    }
    if ((uVar1 == '\0') && (pWal->writeLock = '\0', pWal->exclusiveMode == '\0')) {
      (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,9);
    }
  }
  bVar17 = iVar6 == 0;
LAB_0014b66f:
  if ((bVar17) && ((pWal->hdr).iVersion != 0x2de218)) {
    iVar5 = 0xe;
    sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xff3a,
                "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
  }
  if (pWal->bShmUnreliable != '\0') {
    if (iVar5 == 0) {
      iVar5 = 0;
    }
    else {
      walIndexClose(pWal,0);
      pWal->bShmUnreliable = '\0';
      if (iVar5 == 0x20a) {
        iVar5 = -1;
      }
    }
    pWal->exclusiveMode = '\0';
  }
  return iVar5;
}

Assistant:

static int walIndexReadHdr(Wal *pWal, int *pChanged){
  int rc;                         /* Return code */
  int badHdr;                     /* True if a header read failed */
  volatile u32 *page0;            /* Chunk of wal-index containing header */

  /* Ensure that page 0 of the wal-index (the page that contains the
  ** wal-index header) is mapped. Return early if an error occurs here.
  */
  assert( pChanged );
  rc = walIndexPage(pWal, 0, &page0);
  if( rc!=SQLITE_OK ){
    assert( rc!=SQLITE_READONLY ); /* READONLY changed to OK in walIndexPage */
    if( rc==SQLITE_READONLY_CANTINIT ){
      /* The SQLITE_READONLY_CANTINIT return means that the shared-memory
      ** was openable but is not writable, and this thread is unable to
      ** confirm that another write-capable connection has the shared-memory
      ** open, and hence the content of the shared-memory is unreliable,
      ** since the shared-memory might be inconsistent with the WAL file
      ** and there is no writer on hand to fix it. */
      assert( page0==0 );
      assert( pWal->writeLock==0 );
      assert( pWal->readOnly & WAL_SHM_RDONLY );
      pWal->bShmUnreliable = 1;
      pWal->exclusiveMode = WAL_HEAPMEMORY_MODE;
      *pChanged = 1;
    }else{
      return rc; /* Any other non-OK return is just an error */
    }
  }else{
    /* page0 can be NULL if the SHM is zero bytes in size and pWal->writeLock
    ** is zero, which prevents the SHM from growing */
    testcase( page0!=0 );
  }
  assert( page0!=0 || pWal->writeLock==0 );

  /* If the first page of the wal-index has been mapped, try to read the
  ** wal-index header immediately, without holding any lock. This usually
  ** works, but may fail if the wal-index header is corrupt or currently
  ** being modified by another thread or process.
  */
  badHdr = (page0 ? walIndexTryHdr(pWal, pChanged) : 1);

  /* If the first attempt failed, it might have been due to a race
  ** with a writer.  So get a WRITE lock and try again.
  */
  if( badHdr ){
    if( pWal->bShmUnreliable==0 && (pWal->readOnly & WAL_SHM_RDONLY) ){
      if( SQLITE_OK==(rc = walLockShared(pWal, WAL_WRITE_LOCK)) ){
        walUnlockShared(pWal, WAL_WRITE_LOCK);
        rc = SQLITE_READONLY_RECOVERY;
      }
    }else{
      int bWriteLock = pWal->writeLock;
      if( bWriteLock || SQLITE_OK==(rc = walLockWriter(pWal)) ){
        pWal->writeLock = 1;
        if( SQLITE_OK==(rc = walIndexPage(pWal, 0, &page0)) ){
          badHdr = walIndexTryHdr(pWal, pChanged);
          if( badHdr ){
            /* If the wal-index header is still malformed even while holding
            ** a WRITE lock, it can only mean that the header is corrupted and
            ** needs to be reconstructed.  So run recovery to do exactly that.
            */
            rc = walIndexRecover(pWal);
            *pChanged = 1;
          }
        }
        if( bWriteLock==0 ){
          pWal->writeLock = 0;
          walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
        }
      }
    }
  }

  /* If the header is read successfully, check the version number to make
  ** sure the wal-index was not constructed with some future format that
  ** this version of SQLite cannot understand.
  */
  if( badHdr==0 && pWal->hdr.iVersion!=WALINDEX_MAX_VERSION ){
    rc = SQLITE_CANTOPEN_BKPT;
  }
  if( pWal->bShmUnreliable ){
    if( rc!=SQLITE_OK ){
      walIndexClose(pWal, 0);
      pWal->bShmUnreliable = 0;
      assert( pWal->nWiData>0 && pWal->apWiData[0]==0 );
      /* walIndexRecover() might have returned SHORT_READ if a concurrent
      ** writer truncated the WAL out from under it.  If that happens, it
      ** indicates that a writer has fixed the SHM file for us, so retry */
      if( rc==SQLITE_IOERR_SHORT_READ ) rc = WAL_RETRY;
    }
    pWal->exclusiveMode = WAL_NORMAL_MODE;
  }

  return rc;
}